

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,char *description)

{
  long lVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  ulong uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  char filename [1024];
  char local_428 [1024];
  
  dVar9 = 0.0;
  if (0 < (long)ref_histogram->nbin) {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + ref_histogram->bins[lVar5];
      lVar5 = lVar5 + 1;
    } while (ref_histogram->nbin != lVar5);
    if (0 < iVar4) {
      dVar9 = 1.0 / (double)iVar4;
    }
  }
  snprintf(local_428,0x400,"ref_histogram_%s.tec",description);
  __stream = fopen(local_428,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",local_428);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x109,"ref_histogram_tec","unable to open file");
    RVar2 = 2;
  }
  else {
    uVar3 = (ulong)(uint)ref_histogram->nbin;
    if (2 < ref_histogram->nbin) {
      lVar5 = 0;
      do {
        lVar1 = lVar5 + 1;
        iVar4 = (int)lVar5;
        dVar6 = exp2((double)((iVar4 - ((int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1)) + 1)
                     * (1.0 / ref_histogram->exp));
        dVar7 = exp2((double)(iVar4 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
        dVar6 = ((double)ref_histogram->bins[lVar5] / (dVar6 - dVar7)) * dVar9;
        if (dVar6 <= 1e-20) {
          dVar6 = 1e-20;
        }
        dVar7 = exp2((double)(iVar4 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
        dVar8 = exp2((double)((iVar4 - ref_histogram->nbin / 2) + 1) * (1.0 / ref_histogram->exp));
        fprintf(__stream,"%.8e %.8e\n%.8e %.8e\n",dVar7,dVar6,dVar8,dVar6);
        uVar3 = (ulong)ref_histogram->nbin;
        lVar5 = lVar1;
      } while (lVar1 < (long)(uVar3 - 2));
    }
    fclose(__stream);
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_tec(REF_HISTOGRAM ref_histogram,
                                     const char *description) {
  REF_INT i;
  FILE *f;
  char filename[1024];
  REF_INT sum;
  REF_DBL norm, area, portion;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);
  norm = 0.0;
  if (0 < sum) norm = 1.0 / (REF_DBL)sum;

  snprintf(filename, 1024, "ref_histogram_%s.tec", description);
  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  for (i = 0; i < ref_histogram_nbin(ref_histogram) - 2; i++) {
    area = ref_histogram_to_obs(i + 1) - ref_histogram_to_obs(i);
    portion = (REF_DBL)ref_histogram_bin(ref_histogram, i) / area * norm;
    portion = MAX(portion, 1.0e-20);
    fprintf(f, "%.8e %.8e\n%.8e %.8e\n", ref_histogram_to_obs(i), portion,
            ref_histogram_to_obs(i + 1), portion);
  }

  fclose(f);

  return REF_SUCCESS;
}